

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::syncBackingStore(QWidgetPrivate *this)

{
  QRegionData *pQVar1;
  bool bVar2;
  QWidgetRepaintManager *this_00;
  long in_FS_OFFSET;
  QRegion local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = shouldPaintOnScreen(this);
  if (bVar2) {
    paintOnScreen(this,&this->dirty);
    QRegion::QRegion(&local_20);
    pQVar1 = (this->dirty).d;
    (this->dirty).d = local_20.d;
    local_20.d = pQVar1;
    QRegion::~QRegion(&local_20);
  }
  else {
    this_00 = maybeRepaintManager(this);
    if (this_00 != (QWidgetRepaintManager *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QWidgetRepaintManager::sync((QWidgetRepaintManager *)this_00);
        return;
      }
      goto LAB_002f212f;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_002f212f:
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::syncBackingStore()
{
    if (shouldPaintOnScreen()) {
        paintOnScreen(dirty);
        dirty = QRegion();
    } else if (QWidgetRepaintManager *repaintManager = maybeRepaintManager()) {
        repaintManager->sync();
    }
}